

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O1

void __thiscall
polyscope::render::backend_openGL_mock::GLAttributeBuffer::setData
          (GLAttributeBuffer *this,vector<float,_std::allocator<float>_> *data)

{
  checkType(this,Float);
  setData_helper<float>(this,data);
  return;
}

Assistant:

void GLAttributeBuffer::setData(const std::vector<float>& data) {
  checkType(RenderDataType::Float);
  setData_helper(data);
}